

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_lcy_pbe.c
# Opt level: O0

void xc_hyb_gga_xc_lcy_pbe_init(xc_func_type *p)

{
  xc_func_type *in_RDI;
  xc_func_type *unaff_retaddr;
  double gamma;
  double *in_stack_ffffffffffffffe8;
  double omega;
  
  omega = 0.75;
  xc_hyb_gga_xc_lcy_pbe_init::funcs_coef[0] = 1.0;
  xc_hyb_gga_xc_lcy_pbe_init::funcs_coef[1] = 1.0;
  xc_mix_init(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int *)0x3fe8000000000000,
              in_stack_ffffffffffffffe8);
  xc_func_set_ext_params(unaff_retaddr,(double *)in_RDI);
  xc_hyb_init_camy(in_RDI,1.0,-1.0,omega);
  return;
}

Assistant:

void
xc_hyb_gga_xc_lcy_pbe_init(xc_func_type *p)
{
  static int   funcs_id  [2] = {XC_GGA_X_SFAT_PBE, XC_GGA_C_PBE};
  static double funcs_coef[2];

  double gamma = 0.75;

  funcs_coef[0] = 1.0;
  funcs_coef[1] = 1.0;

  xc_mix_init(p, 2, funcs_id, funcs_coef);

  xc_func_set_ext_params(p->func_aux[0], &gamma);

  xc_hyb_init_camy(p, 1.0, -1.0, gamma);
}